

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O1

void __thiscall
ConfigParser::ParseConfig
          (ConfigParser *this,HANDLE hmod,CmdLineArgsParser *parser,char16 *strCustomConfigFile)

{
  WCHAR WVar1;
  uint uVar2;
  ConfigFlagsTable *pCVar3;
  code *pcVar4;
  WCHAR *pWVar5;
  bool bVar6;
  int c;
  int iVar7;
  DWORD DVar8;
  undefined4 *puVar9;
  ulong uVar10;
  WCHAR *pWVar11;
  PAL_FILE *f;
  long lVar12;
  PAL_FILE *pPVar13;
  ulong uVar14;
  WCHAR *pWVar15;
  size_t _Count;
  WCHAR *_Src;
  int iVar16;
  char16_t *_Ext;
  char16 *_Filename;
  WCHAR local_c78 [4];
  char16 filename [260];
  char16_t local_a68 [4];
  WCHAR configFileFullName [260];
  WCHAR local_858 [4];
  char16 configBuffer [512];
  char16 dir [256];
  char16 modulename [260];
  WCHAR local_36;
  undefined4 local_34;
  char16 drive [3];
  
  if ((strCustomConfigFile == (char16 *)0x0) && (this->_hasReadConfig != false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,0x17a,"(!_hasReadConfig || strCustomConfigFile != nullptr)",
                       "!_hasReadConfig || strCustomConfigFile != nullptr");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  this->_hasReadConfig = true;
  _Filename = strCustomConfigFile;
  if (strCustomConfigFile == (char16 *)0x0) {
    _Filename = this->_configFileName;
  }
  _Ext = L"";
  if (strCustomConfigFile == (char16 *)0x0) {
    _Ext = L".config";
  }
  GetModuleFileNameW(hmod,dir + 0xfc,0x104);
  bVar6 = dir[0xff] == L'\\' &&
          (dir[0xfe] == L'?' && (dir[0xfd] == L'\\' && (char16)dir._504_4_ == L'\\'));
  uVar10 = (ulong)((uint)bVar6 * 8);
  _Src = (WCHAR *)((long)dir + uVar10 + 0x1f8);
  WVar1 = *_Src;
  uVar14 = uVar10 + 2;
  if (WVar1 == L'\0') {
    uVar14 = uVar10;
  }
  if (*(short *)((long)dir + uVar14 + 0x1f8) == 0x3a) {
    wcsncpy_s(&local_36,3,_Src,2);
    _Src = modulename + (ulong)bVar6 * 4 + -2;
    if (WVar1 == L'\0') {
      _Src = (WCHAR *)((long)dir + uVar10 + 0x1fa);
    }
  }
  else {
    local_36 = L'\0';
    local_34 = 0xfdfdfdfd;
  }
  pWVar11 = (WCHAR *)0x0;
  pWVar5 = _Src;
  do {
    do {
      pWVar15 = pWVar11;
      pWVar11 = pWVar5 + 1;
      WVar1 = *pWVar5;
      pWVar5 = pWVar11;
    } while (WVar1 == L'/');
  } while ((WVar1 == L'\\') || (pWVar11 = pWVar15, WVar1 != L'\0'));
  if (pWVar15 == (WCHAR *)0x0) {
    configBuffer[0x1fc] = L'\0';
    memset(configBuffer + 0x1fd,0xfd,0x1fe);
  }
  else {
    _Count = (long)pWVar15 - (long)_Src >> 1;
    if (_Count < 0x100) {
      wcsncpy_s(configBuffer + 0x1fc,0x100,_Src,_Count);
    }
    else {
      local_36 = L'\0';
      local_34 = 0xfdfdfdfd;
      configBuffer[0x1fc] = L'\0';
      memset(configBuffer + 0x1fd,0xfd,0x1fe);
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    }
  }
  _wmakepath_s(local_c78,0x104,&local_36,configBuffer + 0x1fc,_Filename,_Ext);
  f = _wfopen(local_c78,L"r");
  if (f == (PAL_FILE *)0x0) {
    DVar8 = GetEnvironmentVariableW(L"HOME",local_858,0x104);
    if (DVar8 == 0) {
      return;
    }
    StringCchPrintfW(local_a68,0x104,L"%s/%s%s",local_858,_Filename,_Ext);
    pPVar13 = _wfopen(local_a68,L"r");
    if (pPVar13 != (PAL_FILE *)0x0) {
      f = pPVar13;
    }
    if (f == (PAL_FILE *)0x0 || pPVar13 == (PAL_FILE *)0x0) {
      return;
    }
  }
  iVar16 = 0;
  do {
    if (0x1ff < iVar16) break;
    c = PAL_getc(f);
    pCVar3 = this->_flags;
    uVar2 = pCVar3->rawInputFromConfigFileIndex;
    if ((ulong)uVar2 < 0x200) {
      pCVar3->rawInputFromConfigFileIndex = uVar2 + 1;
      pCVar3->rawInputFromConfigFile[uVar2] = (WCHAR)c;
    }
    if ((c == -1) || (iVar7 = isspace(c), c == 0 || iVar7 != 0)) {
      local_858[iVar16] = L'\0';
      if (iVar16 < 1) goto joined_r0x00363664;
      iVar7 = CmdLineArgsParser::Parse(parser,local_858);
      bVar6 = false;
      if ((iVar7 == 0) && (c != -1)) {
        do {
          iVar7 = isspace(c);
          if ((c != 0) && (iVar7 == 0)) {
            PAL_ungetc(c,f);
            iVar16 = 0;
            goto LAB_00363698;
          }
          c = PAL_getc(f);
joined_r0x00363664:
        } while (c != -1);
        bVar6 = false;
      }
    }
    else {
      lVar12 = (long)iVar16;
      iVar16 = iVar16 + 1;
      local_858[lVar12] = (WCHAR)c;
LAB_00363698:
      bVar6 = true;
    }
  } while (bVar6);
  PAL_fclose(f);
  return;
}

Assistant:

void ConfigParser::ParseConfig(HANDLE hmod, CmdLineArgsParser &parser, const char16* strCustomConfigFile)
{
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && CONFIG_PARSE_CONFIG_FILE
    Assert(!_hasReadConfig || strCustomConfigFile != nullptr);
    _hasReadConfig = true;

    const char16* configFileName = strCustomConfigFile;
    const char16* configFileExt = _u(""); /* in the custom config case,
                                             ext is expected to be passed
                                             in as part of the filename */

    if (configFileName == nullptr)
    {
        configFileName = _configFileName;
        configFileExt = _u(".config");
    }

    int err = 0;
    char16 modulename[_MAX_PATH];
    char16 filename[_MAX_PATH];

    GetModuleFileName((HMODULE)hmod, modulename, _MAX_PATH);
    char16 drive[_MAX_DRIVE];
    char16 dir[_MAX_DIR];

    _wsplitpath_s(modulename, drive, _MAX_DRIVE, dir, _MAX_DIR, nullptr, 0, nullptr, 0);
    _wmakepath_s(filename, drive, dir, configFileName, configFileExt);

    FILE* configFile;
#ifdef _WIN32
    if (_wfopen_s(&configFile, filename, _u("r, ccs=UNICODE")) != 0 || configFile == nullptr)
    {
        WCHAR configFileFullName[MAX_PATH];

        StringCchPrintf(configFileFullName, MAX_PATH, _u("%s%s"), configFileName, configFileExt);

        // try the one in the current working directory (Desktop)
        if (_wfullpath(filename, configFileFullName, _MAX_PATH) == nullptr)
        {
            return;
        }

        if (_wfopen_s(&configFile, filename, _u("r, ccs=UNICODE")) != 0 || configFile == nullptr)
        {
            return;
        }
    }
#else
    // Two-pathed for a couple reasons
    // 1. PAL doesn't like the ccs option passed in.
    // 2. _wfullpath is not implemented in the PAL.
    // Instead, on xplat, we'll check the HOME directory to see if there is
    // a config file there that we can use
    if (_wfopen_s(&configFile, filename, _u("r")) != 0 || configFile == nullptr)
    {
        WCHAR homeDir[MAX_PATH];

        if (GetEnvironmentVariable(_u("HOME"), homeDir, MAX_PATH) == 0)
        {
            return;
        }
        
        WCHAR configFileFullName[MAX_PATH];

        StringCchPrintf(configFileFullName, MAX_PATH, _u("%s/%s%s"), homeDir, configFileName, configFileExt);
        if (_wfopen_s(&configFile, configFileFullName, _u("r")) != 0 || configFile == nullptr)
        {
            return;
        }
    }
#endif

    char16 configBuffer[MaxTokenSize];
    int index = 0;

#ifdef _WIN32
#define ReadChar(file) fgetwc(file)
#define UnreadChar(c, file) ungetwc(c, file)
#define CharType wint_t
#define EndChar WEOF
#else
#define ReadChar(file) fgetc(file)
#define UnreadChar(c, file) ungetc(c, file)
#define CharType int
#define EndChar EOF
#endif

    // We don't expect the token to overflow- if it does
    // the simplest thing to do would be to ignore the
    // read tokens
    // We could use _fwscanf_s here but the function
    // isn't implemented in the PAL and we'd have to deal with
    // wchar => char16 impedance mismatch.
    while (index < MaxTokenSize)
    {
        CharType curChar = ReadChar(configFile);

        if (this->_flags.rawInputFromConfigFileIndex < sizeof(this->_flags.rawInputFromConfigFile) / sizeof(this->_flags.rawInputFromConfigFile[0]))
        {
            this->_flags.rawInputFromConfigFile[this->_flags.rawInputFromConfigFileIndex++] = curChar;
        }

        if (curChar == EndChar || isspace(curChar) || curChar == 0)
        {
            configBuffer[index] = 0;

            // Parse only if there's something in configBuffer
            if (index > 0 && (err = parser.Parse(configBuffer)) != 0)
            {
                break;
            }

            while(curChar != EndChar && (isspace(curChar) || curChar == 0))
            {
                curChar = ReadChar(configFile);
            }

            if (curChar == EndChar)
            {
                break;
            }
            else
            {
                UnreadChar(curChar, configFile);
            }

            index = 0;
        }
        else
        {
            // The expectation is that non-ANSI characters
            // are not used in the config- otherwise it will
            // be interpreted incorrectly here
            configBuffer[index++] = (char16) curChar;
        }
    }

#undef ReadChar
#undef UnreadChar
#undef CharType
#undef EndChar

    fclose(configFile);

    if (err !=0)
    {
        return;
    }
#endif
}